

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<bool,void>::convert_abi_cxx11_(bool b)

{
  char *pcVar1;
  byte in_SIL;
  string *in_RDI;
  allocator local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pcVar1 = "false";
  if (local_9 != 0) {
    pcVar1 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a);
  return in_RDI;
}

Assistant:

std::string StringMaker<bool>::convert(bool b) {
    return b ? "true" : "false";
}